

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O2

void __thiscall
checkqueue_tests::test_CheckQueue_FrozenCleanup::test_method(test_CheckQueue_FrozenCleanup *this)

{
  long lVar1;
  bool bVar2;
  int x;
  uint uVar3;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  assertion_result local_90;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  thread t0;
  __single_object queue;
  unique_lock<std::mutex> l;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::make_unique<CCheckQueue<FrozenCleanupCheck>,unsigned_int_const&,int_const&>
            ((uint *)&queue,(int *)&QUEUE_BATCH_SIZE);
  t0._M_id._M_thread = (id)0;
  l._M_device = (mutex_type *)operator_new(0x10);
  ((l._M_device)->super___mutex_base)._M_mutex.__align = (long)&PTR___State_0113b310;
  *(__single_object **)((long)&((l._M_device)->super___mutex_base)._M_mutex + 8) = &queue;
  std::thread::_M_start_thread(&t0,&l,0);
  if (l._M_device != (mutex_type *)0x0) {
    (**(code **)(((l._M_device)->super___mutex_base)._M_mutex.__align + 8))();
  }
  std::unique_lock<std::mutex>::unique_lock(&l,&FrozenCleanupCheck::m);
  while (FrozenCleanupCheck::nFrozen.super___atomic_base<unsigned_long>._M_i != 1) {
    std::condition_variable::wait((unique_lock *)FrozenCleanupCheck::cv);
  }
  std::unique_lock<std::mutex>::~unique_lock(&l);
  bVar2 = false;
  for (uVar3 = 0; (bVar2 == false && (uVar3 < 100)); uVar3 = uVar3 + 1) {
    bVar2 = std::mutex::try_lock
                      ((mutex *)((long)queue._M_t.
                                       super___uniq_ptr_impl<CCheckQueue<FrozenCleanupCheck>,_std::default_delete<CCheckQueue<FrozenCleanupCheck>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_CCheckQueue<FrozenCleanupCheck>_*,_std::default_delete<CCheckQueue<FrozenCleanupCheck>_>_>
                                       .
                                       super__Head_base<0UL,_CCheckQueue<FrozenCleanupCheck>_*,_false>
                                       ._M_head_impl + 0xd8));
  }
  std::unique_lock<std::mutex>::unique_lock(&l,&FrozenCleanupCheck::m);
  LOCK();
  FrozenCleanupCheck::nFrozen.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)0;
  UNLOCK();
  std::unique_lock<std::mutex>::~unique_lock(&l);
  std::condition_variable::notify_one();
  std::thread::join();
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
  ;
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x161;
  file.m_begin = (iterator)&local_68;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_78,msg);
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(bVar2 ^ 1);
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  l._M_owns = false;
  l._M_device = (mutex_type *)&PTR__lazy_ostream_0113a070;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)&l,2,0,WARN,0xb68021,(size_t)&stack0xffffffffffffff50,0x161);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  std::thread::~thread(&t0);
  std::
  unique_ptr<CCheckQueue<FrozenCleanupCheck>,_std::default_delete<CCheckQueue<FrozenCleanupCheck>_>_>
  ::~unique_ptr(&queue);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_CheckQueue_FrozenCleanup)
{
    auto queue = std::make_unique<FrozenCleanup_Queue>(QUEUE_BATCH_SIZE, SCRIPT_CHECK_THREADS);
    bool fails = false;
    std::thread t0([&]() {
        CCheckQueueControl<FrozenCleanupCheck> control(queue.get());
        std::vector<FrozenCleanupCheck> vChecks(1);
        control.Add(std::move(vChecks));
        bool waitResult = control.Wait(); // Hangs here
        assert(waitResult);
    });
    {
        std::unique_lock<std::mutex> l(FrozenCleanupCheck::m);
        // Wait until the queue has finished all jobs and frozen
        FrozenCleanupCheck::cv.wait(l, [](){return FrozenCleanupCheck::nFrozen == 1;});
    }
    // Try to get control of the queue a bunch of times
    for (auto x = 0; x < 100 && !fails; ++x) {
        fails = queue->m_control_mutex.try_lock();
    }
    {
        // Unfreeze (we need lock n case of spurious wakeup)
        std::unique_lock<std::mutex> l(FrozenCleanupCheck::m);
        FrozenCleanupCheck::nFrozen = 0;
    }
    // Awaken frozen destructor
    FrozenCleanupCheck::cv.notify_one();
    // Wait for control to finish
    t0.join();
    BOOST_REQUIRE(!fails);
}